

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# registry-inl.h
# Opt level: O0

void __thiscall spdlog::details::registry::drop_all(registry *this)

{
  mutex_type *in_RDI;
  __shared_ptr<spdlog::logger,_(__gnu_cxx::_Lock_policy)2> *unaff_retaddr;
  lock_guard<std::mutex> lock;
  lock_guard<std::mutex> *in_stack_fffffffffffffff0;
  
  std::lock_guard<std::mutex>::lock_guard(in_stack_fffffffffffffff0,in_RDI);
  std::
  unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<spdlog::logger>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<spdlog::logger>_>_>_>
  ::clear((unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<spdlog::logger>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<spdlog::logger>_>_>_>
           *)0x10de09);
  std::__shared_ptr<spdlog::logger,_(__gnu_cxx::_Lock_policy)2>::reset(unaff_retaddr);
  std::lock_guard<std::mutex>::~lock_guard((lock_guard<std::mutex> *)0x10de23);
  return;
}

Assistant:

SPDLOG_INLINE void registry::drop_all()
{
    std::lock_guard<std::mutex> lock(logger_map_mutex_);
    loggers_.clear();
    default_logger_.reset();
}